

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_write_compressed_pixels
              (fitsfile *fptr,int datatype,LONGLONG fpixel,LONGLONG npixel,int nullcheck,void *array
              ,void *nullval,int *status)

{
  char *pcVar1;
  long lVar2;
  void *local_170;
  char *arrayptr;
  long lastcoord [6];
  long firstcoord [6];
  long local_100;
  long nplane;
  LONGLONG dimsize [6];
  LONGLONG last1;
  LONGLONG last0;
  LONGLONG tlast;
  LONGLONG tfirst;
  long nread;
  long naxes [6];
  int local_60;
  int bytesperpixel;
  int ii;
  int naxis;
  void *array_local;
  LONGLONG LStack_48;
  int nullcheck_local;
  LONGLONG npixel_local;
  LONGLONG fpixel_local;
  fitsfile *pfStack_30;
  int datatype_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    _ii = array;
    array_local._4_4_ = nullcheck;
    LStack_48 = npixel;
    npixel_local = fpixel;
    fpixel_local._4_4_ = datatype;
    pfStack_30 = fptr;
    naxes[5]._4_4_ = ffpxsz(datatype);
    for (local_60 = 0; local_60 < 6; local_60 = local_60 + 1) {
      naxes[(long)local_60 + -1] = 1;
      lastcoord[(long)local_60 + 5] = 0;
      lastcoord[(long)local_60 + -1] = 0;
    }
    ffgidm(pfStack_30,&bytesperpixel,status);
    ffgisz(pfStack_30,6,&nread,status);
    for (local_60 = 1; local_60 < 6; local_60 = local_60 + 1) {
      dimsize[(long)local_60 + -1] =
           dimsize[(long)(local_60 + -1) + -1] * naxes[(long)(local_60 + -1) + -1];
    }
    tlast = npixel_local + -1;
    last0 = tlast + LStack_48 + -1;
    local_60 = bytesperpixel;
    while (lVar2 = lastcoord[0], pcVar1 = arrayptr, local_60 = local_60 + -1, -1 < local_60) {
      lastcoord[(long)local_60 + 5] = tlast / dimsize[(long)local_60 + -1];
      lastcoord[(long)local_60 + -1] = last0 / dimsize[(long)local_60 + -1];
      tlast = tlast - lastcoord[(long)local_60 + 5] * dimsize[(long)local_60 + -1];
      last0 = last0 - lastcoord[(long)local_60 + -1] * dimsize[(long)local_60 + -1];
    }
    if (bytesperpixel == 1) {
      lastcoord[5] = lastcoord[5] + 1;
      arrayptr = arrayptr + 1;
      fits_write_compressed_img
                (pfStack_30,fpixel_local._4_4_,lastcoord + 5,(long *)&arrayptr,array_local._4_4_,_ii
                 ,nullval,status);
      fptr_local._4_4_ = *status;
    }
    else {
      if (bytesperpixel == 2) {
        fits_write_compressed_img_plane
                  (pfStack_30,fpixel_local._4_4_,naxes[5]._4_4_,0,lastcoord + 5,(long *)&arrayptr,
                   &nread,array_local._4_4_,_ii,nullval,&tfirst,status);
      }
      else {
        if (bytesperpixel != 3) {
          ffpmsg("only 1D, 2D, or 3D images are currently supported");
          *status = 0x19d;
          return 0x19d;
        }
        if ((((lastcoord[5] == 0) && (firstcoord[0] == 0)) && (arrayptr == (char *)(nread + -1))) &&
           (lastcoord[0] == naxes[0] + -1)) {
          for (local_60 = 0; local_60 < 6; local_60 = local_60 + 1) {
            lastcoord[(long)local_60 + 5] = lastcoord[(long)local_60 + 5] + 1;
            lastcoord[(long)local_60 + -1] = lastcoord[(long)local_60 + -1] + 1;
          }
          fits_write_compressed_img
                    (pfStack_30,fpixel_local._4_4_,lastcoord + 5,(long *)&arrayptr,array_local._4_4_
                     ,_ii,nullval,status);
          return *status;
        }
        if (firstcoord[1] < lastcoord[1]) {
          arrayptr = (char *)(nread + -1);
          lastcoord[0] = naxes[0] + -1;
        }
        local_170 = array;
        for (local_100 = firstcoord[1]; local_100 <= lastcoord[1]; local_100 = local_100 + 1) {
          if (local_100 == lastcoord[1]) {
            arrayptr = pcVar1;
            lastcoord[0] = lVar2;
          }
          fits_write_compressed_img_plane
                    (pfStack_30,fpixel_local._4_4_,naxes[5]._4_4_,local_100,lastcoord + 5,
                     (long *)&arrayptr,&nread,array_local._4_4_,local_170,nullval,&tfirst,status);
          lastcoord[5] = 0;
          local_170 = (void *)((long)local_170 + tfirst * naxes[5]._4_4_);
        }
      }
      fptr_local._4_4_ = *status;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int fits_write_compressed_pixels(fitsfile *fptr, /* I - FITS file pointer   */
            int  datatype,  /* I - datatype of the array to be written      */
            LONGLONG   fpixel,  /* I - 'first pixel to write          */
            LONGLONG   npixel,  /* I - number of pixels to write      */
            int  nullcheck,  /* I - 0 for no null checking                   */
                             /*     1: pixels that are = nullval will be     */
                             /*     written with the FITS null pixel value   */
                             /*     (floating point arrays only)             */
            void *array,      /* I - array of values to write                */
            void *nullval,    /* I - value used to represent undefined pixels*/
            int  *status)     /* IO - error status                           */
/*
   Write a consecutive set of pixels to a compressed image.  This routine
   interpretes the n-dimensional image as a long one-dimensional array. 
   This is actually a rather inconvenient way to write compressed images in
   general, and could be rather inefficient if the requested pixels to be
   written are located in many different image compression tiles.    

   The general strategy used here is to write the requested pixels in blocks
   that correspond to rectangular image sections.  
*/
{
    int naxis, ii, bytesperpixel;
    long naxes[MAX_COMPRESS_DIM], nread;
    LONGLONG tfirst, tlast, last0, last1, dimsize[MAX_COMPRESS_DIM];
    long nplane, firstcoord[MAX_COMPRESS_DIM], lastcoord[MAX_COMPRESS_DIM];
    char *arrayptr;

    if (*status > 0)
        return(*status);

    arrayptr = (char *) array;

    /* get size of array pixels, in bytes */
    bytesperpixel = ffpxsz(datatype);

    for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
    {
        naxes[ii] = 1;
        firstcoord[ii] = 0;
        lastcoord[ii] = 0;
    }

    /*  determine the dimensions of the image to be written */
    ffgidm(fptr, &naxis, status);
    ffgisz(fptr, MAX_COMPRESS_DIM, naxes, status);

    /* calc the cumulative number of pixels in each successive dimension */
    dimsize[0] = 1;
    for (ii = 1; ii < MAX_COMPRESS_DIM; ii++)
         dimsize[ii] = dimsize[ii - 1] * naxes[ii - 1];

    /*  determine the coordinate of the first and last pixel in the image */
    /*  Use zero based indexes here */
    tfirst = fpixel - 1;
    tlast = tfirst + npixel - 1;
    for (ii = naxis - 1; ii >= 0; ii--)
    {
        firstcoord[ii] = (long) (tfirst / dimsize[ii]);
        lastcoord[ii]  = (long) (tlast / dimsize[ii]);
        tfirst = tfirst - firstcoord[ii] * dimsize[ii];
        tlast = tlast - lastcoord[ii] * dimsize[ii];
    }

    /* to simplify things, treat 1-D, 2-D, and 3-D images as separate cases */

    if (naxis == 1)
    {
        /* Simple: just write the requested range of pixels */

        firstcoord[0] = firstcoord[0] + 1;
        lastcoord[0] = lastcoord[0] + 1;
        fits_write_compressed_img(fptr, datatype, firstcoord, lastcoord,
            nullcheck, array, nullval, status);
        return(*status);
    }
    else if (naxis == 2)
    {
        nplane = 0;  /* write 1st (and only) plane of the image */
        fits_write_compressed_img_plane(fptr, datatype, bytesperpixel,
          nplane, firstcoord, lastcoord, naxes, nullcheck,
          array, nullval, &nread, status);
    }
    else if (naxis == 3)
    {
        /* test for special case: writing an integral number of planes */
        if (firstcoord[0] == 0 && firstcoord[1] == 0 &&
            lastcoord[0] == naxes[0] - 1 && lastcoord[1] == naxes[1] - 1)
        {
            for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
            {
                /* convert from zero base to 1 base */
                (firstcoord[ii])++;
                (lastcoord[ii])++;
            }

            /* we can write the contiguous block of pixels in one go */
            fits_write_compressed_img(fptr, datatype, firstcoord, lastcoord,
                nullcheck, array, nullval, status);
            return(*status);
        }

        /* save last coordinate in temporary variables */
        last0 = lastcoord[0];
        last1 = lastcoord[1];

        if (firstcoord[2] < lastcoord[2])
        {
            /* we will write up to the last pixel in all but the last plane */
            lastcoord[0] = naxes[0] - 1;
            lastcoord[1] = naxes[1] - 1;
        }

        /* write one plane of the cube at a time, for simplicity */
        for (nplane = firstcoord[2]; nplane <= lastcoord[2]; nplane++)
        {
            if (nplane == lastcoord[2])
            {
                lastcoord[0] = (long) last0;
                lastcoord[1] = (long) last1;
            }

            fits_write_compressed_img_plane(fptr, datatype, bytesperpixel,
              nplane, firstcoord, lastcoord, naxes, nullcheck,
              arrayptr, nullval, &nread, status);

            /* for all subsequent planes, we start with the first pixel */
            firstcoord[0] = 0;
            firstcoord[1] = 0;

            /* increment pointers to next elements to be written */
            arrayptr = arrayptr + nread * bytesperpixel;
        }
    }
    else
    {
        ffpmsg("only 1D, 2D, or 3D images are currently supported");
        return(*status = DATA_COMPRESSION_ERR);
    }

    return(*status);
}